

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_exception_handler.hpp
# Opt level: O1

FailCodeType __thiscall
mittens::
GenericExceptionHandler<std::bad_alloc,_mittens::UnHandler<int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/adishavit[P]mittens/examples/2_custom_app_return_codes_with_messages.cpp:18:42)>
::runAction(GenericExceptionHandler<std::bad_alloc,_mittens::UnHandler<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_adishavit[P]mittens_examples_2_custom_app_return_codes_with_messages_cpp:18:42)>
            *this,long *e)

{
  char *__s;
  size_t sVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Caught unhandled std::bad_alloc: ",0x21);
  __s = (char *)(**(code **)(*e + 0x10))(e);
  if (__s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x106080);
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar1);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  return this->failCode_;
}

Assistant:

FailCodeType runAction(ExceptionType& e, std::false_type)
      {
         customAction_(e);
         return failCode_;
      }